

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fApiCase.cpp
# Opt level: O0

void __thiscall deqp::gles2::Functional::ApiCase::expectError(ApiCase *this,deUint32 expected)

{
  qpTestResult qVar1;
  TestLog *this_00;
  MessageBuilder *pMVar2;
  Enum<int,_2UL> EVar3;
  Enum<int,_2UL> local_1b8 [2];
  MessageBuilder local_198;
  GLenum local_18;
  GLenum local_14;
  deUint32 err;
  deUint32 expected_local;
  ApiCase *this_local;
  
  local_14 = expected;
  _err = this;
  local_18 = glu::CallLogWrapper::glGetError(&this->super_CallLogWrapper);
  if (local_18 != local_14) {
    this_00 = tcu::TestContext::getLog
                        ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_198,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar2 = tcu::MessageBuilder::operator<<(&local_198,(char (*) [20])"// ERROR: expected ");
    EVar3 = glu::getErrorStr(local_14);
    local_1b8[0].m_getName = EVar3.m_getName;
    local_1b8[0].m_value = EVar3.m_value;
    pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,local_1b8);
    tcu::MessageBuilder::operator<<(pMVar2,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_198);
    qVar1 = tcu::TestContext::getTestResult
                      ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    if (qVar1 == QP_TEST_RESULT_PASS) {
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
                 "Got invalid error");
    }
  }
  return;
}

Assistant:

void ApiCase::expectError (deUint32 expected)
{
	deUint32 err = glGetError();
	if (err != expected)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "// ERROR: expected " << glu::getErrorStr(expected) << tcu::TestLog::EndMessage;
		if (m_testCtx.getTestResult() == QP_TEST_RESULT_PASS)
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Got invalid error");
	}
}